

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O1

void __thiscall pass_insert_sync_reset_Test::TestBody(pass_insert_sync_reset_Test *this)

{
  size_type *psVar1;
  size_type *psVar2;
  size_type *psVar3;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar4;
  pointer pcVar5;
  undefined1 auVar6 [8];
  undefined8 uVar7;
  size_t sVar8;
  Generator *pGVar9;
  Port *pPVar10;
  Port *__args;
  Port *pPVar11;
  Var *pVVar12;
  Var *pVVar13;
  Port *pPVar14;
  Const *right;
  iterator iVar15;
  mapped_type *pmVar16;
  long lVar17;
  Generator *top;
  char *expected_predicate_value;
  enable_shared_from_this<kratos::Var> *__r;
  pointer *__ptr_2;
  pointer *__ptr;
  undefined1 local_250 [8];
  Context c;
  shared_ptr<kratos::Attribute> attr;
  AssertHelper local_100;
  AssertionResult gtest_ar__6;
  undefined1 auStack_e8 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_c8 [8];
  mapped_type src_parent;
  mapped_type src_child2;
  mapped_type src_child;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  src;
  
  local_250 = (undefined1  [8])&c.modules_._M_h._M_rehash_policy._M_next_resize;
  c.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.modules_._M_h._M_bucket_count = 0;
  c.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.modules_._M_h._M_rehash_policy._4_4_ = 0;
  c.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  c.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&c.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  c.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.generator_hash_._M_h._M_bucket_count = 0;
  c.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&c.enum_defs_;
  c.enum_defs_._M_t._M_impl._0_4_ = 0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  c.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&c.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.empty_generators_._M_h._M_bucket_count = 0;
  c.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c._224_8_ = &c.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  c.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  c.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.tracked_generators_._M_h._M_bucket_count = 0;
  c.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&src_child.field_2 + 8),"parent","");
  pGVar9 = kratos::Context::generator((Context *)local_250,(string *)((long)&src_child.field_2 + 8))
  ;
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"clk","")
  ;
  pPVar10 = kratos::Generator::port
                      (pGVar9,In,(string *)((long)&src_child.field_2 + 8),1,1,Clock,false);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"rst","")
  ;
  __args = kratos::Generator::port
                     (pGVar9,In,(string *)((long)&src_child.field_2 + 8),1,1,AsyncReset,false);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&src_child.field_2 + 8),"clk_en","");
  pPVar11 = kratos::Generator::port
                      (pGVar9,In,(string *)((long)&src_child.field_2 + 8),1,1,ClockEnable,false);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"a","");
  kratos::Generator::port(pGVar9,Out,(string *)((long)&src_child.field_2 + 8),1,1);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"b","");
  pVVar12 = kratos::Generator::var(pGVar9,(string *)((long)&src_child.field_2 + 8),1);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"c","");
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pGVar9;
  pVVar13 = kratos::Generator::var(pGVar9,(string *)((long)&src_child.field_2 + 8),1);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  kratos::Generator::sequential((Generator *)local_c8);
  auVar6 = local_c8;
  __r = &(pPVar10->super_Var).super_enable_shared_from_this<kratos::Var>;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (src_child2.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)__r);
  src_child.field_2._8_8_ = src_child.field_2._8_8_ & 0xffffffff00000000;
  src._M_t._M_impl._0_8_ = src_child2.field_2._8_8_;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = src_child._M_dataplus._M_p;
  src_child2.field_2._8_8_ = 0;
  src_child._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)auVar6,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&src_child.field_2 + 8));
  if (src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  src_child.field_2._8_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,kratos::Port&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src,
             (IfStmt **)((long)&src_child.field_2 + 8),
             (allocator<kratos::IfStmt> *)((long)&src_child2.field_2 + 8),__args);
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)
             (src_child.field_2._M_local_buf + 8),(IfStmt *)src_child.field_2._8_8_);
  uVar7 = src_child.field_2._8_8_;
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)((long)&src_parent.field_2 + 8),pVVar12);
  src_child2.field_2._8_8_ = src_parent.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_parent.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)((long)&src_child2.field_2 + 8));
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  uVar7 = src_child.field_2._8_8_;
  kratos::Var::assign((Var *)((long)&src_parent.field_2 + 8),pVVar13);
  src_child2.field_2._8_8_ = src_parent.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_parent.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_else_stmt
            ((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)((long)&src_child2.field_2 + 8));
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  src_child2.field_2._8_8_ = src_child.field_2._8_8_;
  src_child._M_dataplus._M_p = (pointer)src._M_t._M_impl._0_8_;
  if (src._M_t._M_impl._0_8_ != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(src._M_t._M_impl._0_8_ + 8) = *(int *)(src._M_t._M_impl._0_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(src._M_t._M_impl._0_8_ + 8) = *(int *)(src._M_t._M_impl._0_8_ + 8) + 1;
    }
  }
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)local_c8,(shared_ptr<kratos::Stmt> *)((long)&src_child2.field_2 + 8));
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  if (src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_t._M_impl._0_8_);
  }
  if (src_parent._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_parent._M_dataplus._M_p);
  }
  kratos::Generator::sequential((Generator *)local_c8);
  auVar6 = local_c8;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (src_child2.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)__r);
  src_child.field_2._8_8_ = src_child.field_2._8_8_ & 0xffffffff00000000;
  src._M_t._M_impl._0_8_ = src_child2.field_2._8_8_;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = src_child._M_dataplus._M_p;
  src_child2.field_2._8_8_ = 0;
  src_child._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)auVar6,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&src_child.field_2 + 8));
  if (src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  src_child.field_2._8_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,kratos::Port&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src,
             (IfStmt **)((long)&src_child.field_2 + 8),
             (allocator<kratos::IfStmt> *)((long)&src_child2.field_2 + 8),__args);
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)
             (src_child.field_2._M_local_buf + 8),(IfStmt *)src_child.field_2._8_8_);
  uVar7 = src_child.field_2._8_8_;
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)((long)&src_parent.field_2 + 8),pVVar12);
  src_child2.field_2._8_8_ = src_parent.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_parent.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)((long)&src_child2.field_2 + 8));
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  src_child2.field_2._8_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,kratos::Port&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child,
             (IfStmt **)((long)&src_child2.field_2 + 8),
             (allocator<kratos::IfStmt> *)((long)&src_parent.field_2 + 8),pPVar11);
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)
             (src_child2.field_2._M_local_buf + 8),(IfStmt *)src_child2.field_2._8_8_);
  uVar7 = src_child2.field_2._8_8_;
  kratos::Var::assign((Var *)auStack_e8,pVVar13);
  src_parent.field_2._8_8_ = auStack_e8;
  src_child2._M_dataplus._M_p = (pointer)gtest_ar__5._0_8_;
  auStack_e8 = (undefined1  [8])0x0;
  gtest_ar__5.success_ = false;
  gtest_ar__5._1_7_ = 0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)((long)&src_parent.field_2 + 8));
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  if (gtest_ar__5._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_ar__5._0_8_);
  }
  src_parent.field_2._8_8_ = src_child2.field_2._8_8_;
  src_child2._M_dataplus = src_child._M_dataplus;
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(src_child._M_dataplus._M_p + 8) = *(int *)(src_child._M_dataplus._M_p + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(src_child._M_dataplus._M_p + 8) = *(int *)(src_child._M_dataplus._M_p + 8) + 1;
    }
  }
  kratos::IfStmt::add_else_stmt
            ((IfStmt *)src_child.field_2._8_8_,
             (shared_ptr<kratos::Stmt> *)((long)&src_parent.field_2 + 8));
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  src_parent.field_2._8_8_ = src_child.field_2._8_8_;
  src_child2._M_dataplus._M_p = (pointer)src._M_t._M_impl._0_8_;
  if (src._M_t._M_impl._0_8_ != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(src._M_t._M_impl._0_8_ + 8) = *(int *)(src._M_t._M_impl._0_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(src._M_t._M_impl._0_8_ + 8) = *(int *)(src._M_t._M_impl._0_8_ + 8) + 1;
    }
  }
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)local_c8,(shared_ptr<kratos::Stmt> *)((long)&src_parent.field_2 + 8));
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  if (src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_t._M_impl._0_8_);
  }
  if (src_parent._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_parent._M_dataplus._M_p);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&src_child.field_2 + 8),"child","");
  pGVar9 = kratos::Context::generator((Context *)local_250,(string *)((long)&src_child.field_2 + 8))
  ;
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&src_child.field_2 + 8),"child","");
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_c8,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &pGVar9->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            ((Generator *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)((long)&src_child.field_2 + 8),(shared_ptr<kratos::Generator> *)local_c8);
  if (src_parent._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_parent._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"clk","")
  ;
  pPVar11 = kratos::Generator::port
                      (pGVar9,In,(string *)((long)&src_child.field_2 + 8),1,1,Clock,false);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"rst","")
  ;
  pPVar14 = kratos::Generator::port
                      (pGVar9,In,(string *)((long)&src_child.field_2 + 8),1,1,AsyncReset,false);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  sVar8 = src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  kratos::Generator::wire
            ((Generator *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,&pPVar11->super_Var,
             &pPVar10->super_Var);
  kratos::Generator::wire((Generator *)sVar8,&pPVar14->super_Var,&__args->super_Var);
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"a","");
  kratos::Generator::var(pGVar9,(string *)((long)&src_child.field_2 + 8),1);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"b","");
  pVVar12 = kratos::Generator::var(pGVar9,(string *)((long)&src_child.field_2 + 8),1);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"c","");
  pVVar13 = kratos::Generator::var(pGVar9,(string *)((long)&src_child.field_2 + 8),1);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  kratos::Generator::sequential((Generator *)local_c8);
  auVar6 = local_c8;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (src_child2.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar11->super_Var).super_enable_shared_from_this<kratos::Var>);
  src_child.field_2._8_8_ = src_child.field_2._8_8_ & 0xffffffff00000000;
  src._M_t._M_impl._0_8_ = src_child2.field_2._8_8_;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = src_child._M_dataplus._M_p;
  src_child2.field_2._8_8_ = 0;
  src_child._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)auVar6,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&src_child.field_2 + 8));
  if (src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  src_child.field_2._8_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,kratos::Port&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src,
             (IfStmt **)((long)&src_child.field_2 + 8),
             (allocator<kratos::IfStmt> *)((long)&src_child2.field_2 + 8),pPVar14);
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)
             (src_child.field_2._M_local_buf + 8),(IfStmt *)src_child.field_2._8_8_);
  uVar7 = src_child.field_2._8_8_;
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)((long)&src_parent.field_2 + 8),pVVar12);
  src_child2.field_2._8_8_ = src_parent.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_parent.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)((long)&src_child2.field_2 + 8));
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  uVar7 = src_child.field_2._8_8_;
  kratos::Var::assign((Var *)((long)&src_parent.field_2 + 8),pVVar13);
  src_child2.field_2._8_8_ = src_parent.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_parent.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_else_stmt
            ((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)((long)&src_child2.field_2 + 8));
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  src_child2.field_2._8_8_ = src_child.field_2._8_8_;
  src_child._M_dataplus._M_p = (pointer)src._M_t._M_impl._0_8_;
  if (src._M_t._M_impl._0_8_ != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(src._M_t._M_impl._0_8_ + 8) = *(int *)(src._M_t._M_impl._0_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(src._M_t._M_impl._0_8_ + 8) = *(int *)(src._M_t._M_impl._0_8_ + 8) + 1;
    }
  }
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)local_c8,(shared_ptr<kratos::Stmt> *)((long)&src_child2.field_2 + 8));
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  if (src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_t._M_impl._0_8_);
  }
  if (src_parent._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_parent._M_dataplus._M_p);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&src_child.field_2 + 8),"child2","");
  pGVar9 = kratos::Context::generator((Context *)local_250,(string *)((long)&src_child.field_2 + 8))
  ;
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&src_child.field_2 + 8),"child2","");
  kratos::Generator::add_child_generator
            ((Generator *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)((long)&src_child.field_2 + 8),pGVar9);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"clk","")
  ;
  pPVar11 = kratos::Generator::port
                      (pGVar9,In,(string *)((long)&src_child.field_2 + 8),1,1,Clock,false);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"rst","")
  ;
  pPVar14 = kratos::Generator::port
                      (pGVar9,In,(string *)((long)&src_child.field_2 + 8),1,1,AsyncReset,false);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  sVar8 = src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  kratos::Generator::wire
            ((Generator *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,&pPVar11->super_Var,
             &pPVar10->super_Var);
  kratos::Generator::wire((Generator *)sVar8,&pPVar14->super_Var,&__args->super_Var);
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"a","");
  kratos::Generator::var(pGVar9,(string *)((long)&src_child.field_2 + 8),1);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"b","");
  pVVar12 = kratos::Generator::var(pGVar9,(string *)((long)&src_child.field_2 + 8),1);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&src_child.field_2 + 8),"c","");
  pVVar13 = kratos::Generator::var(pGVar9,(string *)((long)&src_child.field_2 + 8),1);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  src_child.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&src_child.field_2 + 8),"flush","");
  expected_predicate_value = (char *)0x3;
  pPVar10 = kratos::Generator::port
                      (pGVar9,In,(string *)((long)&src_child.field_2 + 8),1,1,Reset,false);
  if ((_Rb_tree_header *)src_child.field_2._8_8_ != &src._M_t._M_impl.super__Rb_tree_header) {
    operator_delete((void *)src_child.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  right = kratos::Const::constant(1,1,false);
  kratos::Generator::wire
            ((Generator *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,&pPVar10->super_Var,
             &right->super_Var);
  kratos::Generator::sequential((Generator *)local_c8);
  auVar6 = local_c8;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (src_child2.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar11->super_Var).super_enable_shared_from_this<kratos::Var>);
  src_child.field_2._8_8_ = src_child.field_2._8_8_ & 0xffffffff00000000;
  src._M_t._M_impl._0_8_ = src_child2.field_2._8_8_;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = src_child._M_dataplus._M_p;
  src_child2.field_2._8_8_ = 0;
  src_child._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)auVar6,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&src_child.field_2 + 8));
  if (src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  src_child.field_2._8_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,kratos::Port&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src,
             (IfStmt **)((long)&src_child.field_2 + 8),
             (allocator<kratos::IfStmt> *)((long)&src_child2.field_2 + 8),pPVar14);
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)
             (src_child.field_2._M_local_buf + 8),(IfStmt *)src_child.field_2._8_8_);
  uVar7 = src_child.field_2._8_8_;
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)((long)&src_parent.field_2 + 8),pVVar12);
  src_child2.field_2._8_8_ = src_parent.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_parent.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)((long)&src_child2.field_2 + 8));
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  src_child2.field_2._8_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,kratos::Port&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child,
             (IfStmt **)((long)&src_child2.field_2 + 8),
             (allocator<kratos::IfStmt> *)((long)&src_parent.field_2 + 8),pPVar10);
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)
             (src_child2.field_2._M_local_buf + 8),(IfStmt *)src_child2.field_2._8_8_);
  uVar7 = src_child2.field_2._8_8_;
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)auStack_e8,pVVar13);
  src_parent.field_2._8_8_ = auStack_e8;
  src_child2._M_dataplus._M_p = (pointer)gtest_ar__5._0_8_;
  auStack_e8 = (undefined1  [8])0x0;
  gtest_ar__5.success_ = false;
  gtest_ar__5._1_7_ = 0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)((long)&src_parent.field_2 + 8));
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  if (gtest_ar__5._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_ar__5._0_8_);
  }
  uVar7 = src_child2.field_2._8_8_;
  kratos::Var::assign((Var *)auStack_e8,pVVar13);
  src_parent.field_2._8_8_ = auStack_e8;
  src_child2._M_dataplus._M_p = (pointer)gtest_ar__5._0_8_;
  auStack_e8 = (undefined1  [8])0x0;
  gtest_ar__5.success_ = false;
  gtest_ar__5._1_7_ = 0;
  kratos::IfStmt::add_else_stmt
            ((IfStmt *)uVar7,(shared_ptr<kratos::Stmt> *)((long)&src_parent.field_2 + 8));
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  if (gtest_ar__5._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)gtest_ar__5._0_8_);
  }
  src_parent.field_2._8_8_ = src_child2.field_2._8_8_;
  src_child2._M_dataplus = src_child._M_dataplus;
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(src_child._M_dataplus._M_p + 8) = *(int *)(src_child._M_dataplus._M_p + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(src_child._M_dataplus._M_p + 8) = *(int *)(src_child._M_dataplus._M_p + 8) + 1;
    }
  }
  kratos::IfStmt::add_else_stmt
            ((IfStmt *)src_child.field_2._8_8_,
             (shared_ptr<kratos::Stmt> *)((long)&src_parent.field_2 + 8));
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  src_parent.field_2._8_8_ = src_child.field_2._8_8_;
  src_child2._M_dataplus._M_p = (pointer)src._M_t._M_impl._0_8_;
  if (src._M_t._M_impl._0_8_ != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(src._M_t._M_impl._0_8_ + 8) = *(int *)(src._M_t._M_impl._0_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(src._M_t._M_impl._0_8_ + 8) = *(int *)(src._M_t._M_impl._0_8_ + 8) + 1;
    }
  }
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)local_c8,(shared_ptr<kratos::Stmt> *)((long)&src_parent.field_2 + 8));
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child2._M_dataplus._M_p);
  }
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_child._M_dataplus._M_p);
  }
  if (src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_t._M_impl._0_8_);
  }
  if (src_parent._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src_parent._M_dataplus._M_p);
  }
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0x68);
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_str).
  _M_dataplus._M_p = (pointer)0x100000001;
  (attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Attribute =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_002b8800;
  c.tracked_generators_._M_h._M_single_bucket =
       (__node_base_ptr)
       &((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_str).
        _M_string_length;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_str).
  _M_string_length = 0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_str).
  field_2._M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           type_str).field_2 + 8) = 0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str).
  _M_dataplus._M_p = (pointer)0x0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str).
  _M_string_length = 0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str).
  field_2._M_allocated_capacity = 0;
  *(undefined8 *)
   ((long)&((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           value_str).field_2 + 8) = 0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->target_).
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->target_).
  super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]._vptr_Attribute =
       (_func_int **)0x0;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].type_str.
  _M_dataplus._M_p = (pointer)0x0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_str).
  _M_string_length = (size_type)&PTR__Attribute_002b8850;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_str).
  field_2._M_allocated_capacity =
       (size_type)
       &(attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str;
  *(undefined8 *)
   ((long)&((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           type_str).field_2 + 8) = 0;
  *(undefined1 *)
   &((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str).
    _M_dataplus._M_p = 0;
  ((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->value_str).
  field_2._M_allocated_capacity =
       (size_type)
       &(attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->target_;
  *(undefined8 *)
   ((long)&((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           value_str).field_2 + 8) = 0;
  *(undefined1 *)
   &((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->target_).
    super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]._vptr_Attribute =
       (_func_int **)0x0;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].type_str.
  _M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&((attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      )->value_str).field_2,0,
             *(char **)((long)&((attr.
                                 super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->value_str).field_2 + 8),0x247571);
  sVar8 = src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
  ::emplace_back<std::shared_ptr<kratos::Attribute>const&>
            ((vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
              *)(src._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x50),
             (shared_ptr<kratos::Attribute> *)&c.tracked_generators_._M_h._M_single_bucket);
  kratos::auto_insert_sync_reset((Generator *)sVar8);
  kratos::fix_assignment_type((Generator *)sVar8);
  kratos::create_module_instantiation((Generator *)sVar8);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&src_child.field_2 + 8),(kratos *)sVar8,top);
  psVar2 = &src_parent._M_string_length;
  local_c8 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"parent","");
  iVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&src_child.field_2 + 8),(key_type *)local_c8);
  src_child2.field_2._M_local_buf[8] = iVar15._M_node != (_Base_ptr)&src;
  src_child._M_dataplus._M_p = (pointer)0x0;
  if (local_c8 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_c8,src_parent._M_string_length + 1);
  }
  if (src_child2.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)((long)&src_parent.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)(src_child2.field_2._M_local_buf + 8),
               (AssertionResult *)"src.find(\"parent\") != src.end()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x142,(char *)local_c8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)auStack_e8,(Message *)((long)&src_parent.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_e8);
    if (local_c8 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_c8,src_parent._M_string_length + 1);
    }
    if (src_parent.field_2._8_8_ != 0) {
      (**(code **)(*(long *)src_parent.field_2._8_8_ + 8))();
    }
  }
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&src_child,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 src_child._M_dataplus._M_p);
  }
  local_c8 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"child","");
  iVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&src_child.field_2 + 8),(key_type *)local_c8);
  src_child2.field_2._M_local_buf[8] = iVar15._M_node != (_Base_ptr)&src;
  src_child._M_dataplus._M_p = (pointer)0x0;
  if (local_c8 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_c8,src_parent._M_string_length + 1);
  }
  if (src_child2.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)((long)&src_parent.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)(src_child2.field_2._M_local_buf + 8),
               (AssertionResult *)"src.find(\"child\") != src.end()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x143,(char *)local_c8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)auStack_e8,(Message *)((long)&src_parent.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_e8);
    if (local_c8 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_c8,src_parent._M_string_length + 1);
    }
    if (src_parent.field_2._8_8_ != 0) {
      (**(code **)(*(long *)src_parent.field_2._8_8_ + 8))();
    }
  }
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&src_child,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 src_child._M_dataplus._M_p);
  }
  local_c8 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"child2","");
  iVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&src_child.field_2 + 8),(key_type *)local_c8);
  src_child2.field_2._M_local_buf[8] = iVar15._M_node != (_Base_ptr)&src;
  src_child._M_dataplus._M_p = (pointer)0x0;
  if (local_c8 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_c8,src_parent._M_string_length + 1);
  }
  if (src_child2.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)((long)&src_parent.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_c8,(internal *)(src_child2.field_2._M_local_buf + 8),
               (AssertionResult *)"src.find(\"child2\") != src.end()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x144,(char *)local_c8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)auStack_e8,(Message *)((long)&src_parent.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_e8);
    if (local_c8 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_c8,src_parent._M_string_length + 1);
    }
    if (src_parent.field_2._8_8_ != 0) {
      (**(code **)(*(long *)src_parent.field_2._8_8_ + 8))();
    }
  }
  if (src_child._M_dataplus._M_p != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&src_child,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 src_child._M_dataplus._M_p);
  }
  psVar1 = &src_child._M_string_length;
  src_child2.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&src_child2.field_2 + 8),"parent","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&src_child.field_2 + 8),(key_type *)((long)&src_child2.field_2 + 8));
  pcVar5 = (pmVar16->_M_dataplus)._M_p;
  local_c8 = (undefined1  [8])psVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar5,pcVar5 + pmVar16->_M_string_length);
  if ((size_type *)src_child2.field_2._8_8_ != psVar1) {
    operator_delete((void *)src_child2.field_2._8_8_,src_child._M_string_length + 1);
  }
  lVar17 = std::__cxx11::string::find(local_c8,0x247594,0);
  src_parent.field_2._M_local_buf[8] = lVar17 != -1;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  if (lVar17 == -1) {
    testing::Message::Message((Message *)auStack_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&src_child2.field_2 + 8),
               (internal *)(src_parent.field_2._M_local_buf + 8),
               (AssertionResult *)
               "src_parent.find(\"else if (flush) begin\\n\" \"    b <= 1\'h0;\\n\" \"  end\") != std::string::npos"
               ,"false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x148,(char *)src_child2.field_2._8_8_);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)auStack_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if ((size_type *)src_child2.field_2._8_8_ != psVar1) {
      operator_delete((void *)src_child2.field_2._8_8_,src_child._M_string_length + 1);
    }
    if (auStack_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)auStack_e8 + 8))();
    }
  }
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&src_child2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 src_child2._M_dataplus._M_p);
  }
  lVar17 = std::__cxx11::string::find(local_c8,0x24761a,0);
  src_parent.field_2._M_local_buf[8] = lVar17 != -1;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  if (lVar17 == -1) {
    testing::Message::Message((Message *)auStack_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&src_child2.field_2 + 8),
               (internal *)(src_parent.field_2._M_local_buf + 8),
               (AssertionResult *)
               "src_parent.find(\"child2 child2 (\\n\" \"  .clk(clk),\\n\" \"  .flush(flush),\") != std::string::npos"
               ,"false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x14b,(char *)src_child2.field_2._8_8_);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)auStack_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if ((size_type *)src_child2.field_2._8_8_ != psVar1) {
      operator_delete((void *)src_child2.field_2._8_8_,src_child._M_string_length + 1);
    }
    if (auStack_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)auStack_e8 + 8))();
    }
  }
  if (src_child2._M_dataplus._M_p != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&src_child2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 src_child2._M_dataplus._M_p);
  }
  psVar3 = &src_child2._M_string_length;
  src_parent.field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&src_parent.field_2 + 8),"child","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&src_child.field_2 + 8),(key_type *)((long)&src_parent.field_2 + 8));
  pcVar5 = (pmVar16->_M_dataplus)._M_p;
  src_child2.field_2._8_8_ = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&src_child2.field_2 + 8),pcVar5,pcVar5 + pmVar16->_M_string_length);
  if ((size_type *)src_parent.field_2._8_8_ != psVar3) {
    operator_delete((void *)src_parent.field_2._8_8_,src_child2._M_string_length + 1);
  }
  lVar17 = std::__cxx11::string::find(src_child2.field_2._M_local_buf + 8,0x2476a6,0);
  auStack_e8[0] = lVar17 != -1;
  gtest_ar__5.success_ = false;
  gtest_ar__5._1_7_ = 0;
  if (lVar17 == -1) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&src_parent.field_2 + 8),(internal *)auStack_e8,
               (AssertionResult *)
               "src_child.find(\"else if (flush) begin\\n\" \"    b <= 1\'h0;\") != std::string::npos"
               ,"false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x14e,(char *)src_parent.field_2._8_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__6.message_,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    if ((size_type *)src_parent.field_2._8_8_ != psVar3) {
      operator_delete((void *)src_parent.field_2._8_8_,src_child2._M_string_length + 1);
    }
    if ((long *)CONCAT71(local_100.data_._1_7_,local_100.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_100.data_._1_7_,local_100.data_._0_1_) + 8))();
    }
  }
  if (gtest_ar__5._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar__5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__5._0_8_);
  }
  puVar4 = &gtest_ar__5.message_;
  auStack_e8 = (undefined1  [8])puVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_e8,"child2","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&src_child.field_2 + 8),(key_type *)auStack_e8);
  pcVar5 = (pmVar16->_M_dataplus)._M_p;
  src_parent.field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&src_parent.field_2 + 8),pcVar5,pcVar5 + pmVar16->_M_string_length);
  if (auStack_e8 != (undefined1  [8])puVar4) {
    operator_delete((void *)auStack_e8,
                    (long)gtest_ar__5.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 1);
  }
  lVar17 = std::__cxx11::string::find(src_parent.field_2._M_local_buf + 8,0x24771b,0);
  local_100.data_._0_1_ = (internal)(lVar17 != -1);
  gtest_ar__6.success_ = false;
  gtest_ar__6._1_7_ = 0;
  if (!(bool)local_100.data_._0_1_) {
    testing::Message::Message((Message *)&gtest_ar__6.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_e8,(internal *)&local_100,
               (AssertionResult *)
               "src_child2.find(\"else if (flush) begin\\n\" \"    c <= 1\'h1;\") != std::string::npos"
               ,"false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x151,(char *)auStack_e8);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (Message *)&gtest_ar__6.message_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (auStack_e8 != (undefined1  [8])puVar4) {
      operator_delete((void *)auStack_e8,
                      (long)gtest_ar__5.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar__6.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (gtest_ar__6._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar__6,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__6._0_8_);
  }
  if ((size_type *)src_parent.field_2._8_8_ != psVar3) {
    operator_delete((void *)src_parent.field_2._8_8_,src_child2._M_string_length + 1);
  }
  if ((size_type *)src_child2.field_2._8_8_ != psVar1) {
    operator_delete((void *)src_child2.field_2._8_8_,src_child._M_string_length + 1);
  }
  if (local_c8 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_c8,src_parent._M_string_length + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&src_child.field_2 + 8));
  if (attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&c.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&c.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_250);
  return;
}

Assistant:

TEST(pass, insert_sync_reset) {  // NOLINT
    Context c;
    auto &parent = c.generator("parent");
    auto &clk = parent.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst = parent.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    auto &clk_en = parent.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    auto &a = parent.port(PortDirection::Out, "a", 1);
    auto &b = parent.var("b", 1);
    auto &c_ = parent.var("c", 1);

    // this is the one with reset logic
    {
        auto seq_parent = parent.sequential();
        seq_parent->add_condition({EventEdgeType::Posedge, clk.shared_from_this()});
        auto if_seq_parent = std::make_shared<IfStmt>(rst);
        if_seq_parent->add_then_stmt(b.assign(constant(0, 1)));
        if_seq_parent->add_else_stmt(c_.assign(a));
        seq_parent->add_stmt(if_seq_parent);
    }

    // this is the one with both reset and clock enable
    {
        auto seq_parent = parent.sequential();
        seq_parent->add_condition({EventEdgeType::Posedge, clk.shared_from_this()});
        auto if_seq_parent = std::make_shared<IfStmt>(rst);
        if_seq_parent->add_then_stmt(b.assign(constant(0, 1)));
        auto if_clk_en = std::make_shared<IfStmt>(clk_en);
        if_clk_en->add_then_stmt(c_.assign(a));
        if_seq_parent->add_else_stmt(if_clk_en);
        seq_parent->add_stmt(if_seq_parent);
    }

    // test child wiring
    auto &child = c.generator("child");
    parent.add_child_generator("child", child.shared_from_this());
    auto &clk_child = child.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst_child = child.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    parent.wire(clk_child, clk);
    parent.wire(rst_child, rst);
    {
        auto &a_child = child.var("a", 1);
        auto &b_child = child.var("b", 1);
        auto &c_child = child.var("c", 1);
        auto seq_child = child.sequential();
        seq_child->add_condition({EventEdgeType::Posedge, clk_child.shared_from_this()});
        // same thing as the parent
        auto if_seq_child = std::make_shared<IfStmt>(rst_child);
        if_seq_child->add_then_stmt(b_child.assign(constant(0, 1)));
        if_seq_child->add_else_stmt(c_child.assign(a_child));
        seq_child->add_stmt(if_seq_child);
    }

    // this child already has it's own flush logic
    auto &child2 = c.generator("child2");
    parent.add_child_generator("child2", child2);
    auto &clk_child2 = child2.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst_child2 = child2.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    parent.wire(clk_child2, clk);
    parent.wire(rst_child2, rst);
    {
        auto &a_child = child2.var("a", 1);
        auto &b_child = child2.var("b", 1);
        auto &c_child = child2.var("c", 1);
        auto &flush = child2.port(PortDirection::In, "flush", 1, PortType::Reset);
        parent.wire(flush, constant(1, 1));
        auto seq_child = child2.sequential();
        seq_child->add_condition({EventEdgeType::Posedge, clk_child2.shared_from_this()});
        // same thing as the parent
        auto if_seq_child = std::make_shared<IfStmt>(rst_child2);
        if_seq_child->add_then_stmt(b_child.assign(constant(0, 1)));
        auto if_2 = std::make_shared<IfStmt>(flush);
        if_2->add_then_stmt(c_child.assign(constant(1, 1)));
        if_2->add_else_stmt(c_child.assign(a_child));
        if_seq_child->add_else_stmt(if_2);
        seq_child->add_stmt(if_seq_child);
    }

    // add attribute
    auto attr = std::make_shared<Attribute>();
    attr->value_str = "sync-reset=flush;over_clk_en=false";
    parent.add_attribute(attr);
    auto_insert_sync_reset(&parent);
    fix_assignment_type(&parent);
    create_module_instantiation(&parent);

    auto src = generate_verilog(&parent);
    EXPECT_TRUE(src.find("parent") != src.end());
    EXPECT_TRUE(src.find("child") != src.end());
    EXPECT_TRUE(src.find("child2") != src.end());
    auto src_parent = src.at("parent");
    EXPECT_TRUE(src_parent.find("else if (flush) begin\n"
                                "    b <= 1'h0;\n"
                                "  end") != std::string::npos);
    EXPECT_TRUE(src_parent.find("child2 child2 (\n"
                                "  .clk(clk),\n"
                                "  .flush(flush),") != std::string::npos);
    auto src_child = src.at("child");
    EXPECT_TRUE(src_child.find("else if (flush) begin\n"
                               "    b <= 1'h0;") != std::string::npos);
    auto src_child2 = src.at("child2");
    EXPECT_TRUE(src_child2.find("else if (flush) begin\n"
                                "    c <= 1'h1;") != std::string::npos);
}